

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O3

void s_task_init_system_(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  s_list_init((s_list_t *)(lVar1 + -0xf8));
  s_list_init((s_list_t *)(lVar1 + -200));
  s_list_init((s_list_t *)(lVar1 + -0xb8));
  rbt_create((RBTree *)(lVar1 + -0xe0),s_timer_comparator,(void *)0x0);
  uv_timer_init((uv_loop_t *)in_FS_OFFSET[-0x15],(uv_timer_t *)(lVar1 + -0xa0));
  s_list_init((s_list_t *)(lVar1 + -0x150));
  s_event_init((s_event_t *)(lVar1 + -0x140));
  in_FS_OFFSET[-0x21] = 0;
  *(undefined2 *)(in_FS_OFFSET + -0x20) = 0;
  in_FS_OFFSET[-0x1d] = lVar1 + -0x150;
  return;
}

Assistant:

void s_task_init_system_() {
#if defined USE_IN_EMBEDDED    
    s_list_init(&g_globals.irq_active_tasks);
    g_globals.irq_actived = 0;
#endif

    s_list_init(&g_globals.active_tasks);
#ifdef USE_DEAD_TASK_CHECKING	
    s_list_init(&g_globals.waiting_mutexes);
    s_list_init(&g_globals.waiting_events);
#endif

#ifndef USE_LIST_TIMER_CONTAINER
    rbt_create(&g_globals.timers,
        s_timer_comparator,
        NULL
    );
#else
    s_list_init(&g_globals.timers);
#endif

    my_clock_init();

    s_list_init(&g_globals.main_task.node);
    s_event_init(&g_globals.main_task.join_event);
    g_globals.main_task.stack_size = 0;
    g_globals.main_task.closed = false;
    g_globals.main_task.waiting_cancelled = false;
    g_globals.current_task = &g_globals.main_task;
}